

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_url_decode(char *src,int src_len,char *dst,int dst_len,int is_form_url_encoded)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ushort *puVar5;
  long lVar6;
  byte bVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  int iVar10;
  long lVar11;
  
  lVar11 = 0;
  iVar10 = 0;
  do {
    if ((src_len <= iVar10) || (dst_len + -1 <= lVar11)) {
      dst[lVar11] = '\0';
      lVar6 = -1;
      if (src_len <= iVar10) {
        lVar6 = lVar11;
      }
      return (int)lVar6;
    }
    cVar1 = src[iVar10];
    if (iVar10 < src_len + -2 && cVar1 == '%') {
      ppuVar8 = __ctype_b_loc();
      puVar5 = *ppuVar8;
      bVar7 = src[(long)iVar10 + 1];
      if (((*(byte *)((long)puVar5 + (ulong)bVar7 * 2 + 1) & 0x10) == 0) ||
         (bVar2 = src[(long)iVar10 + 2],
         (*(byte *)((long)puVar5 + (ulong)bVar2 * 2 + 1) & 0x10) == 0)) {
LAB_00105ecf:
        dst[lVar11] = cVar1;
      }
      else {
        pp_Var9 = __ctype_tolower_loc();
        iVar3 = (*pp_Var9)[bVar7];
        iVar4 = (*pp_Var9)[bVar2];
        cVar1 = (char)iVar4;
        bVar7 = cVar1 + 0xa9;
        if ((puVar5[iVar4] >> 0xb & 1) != 0) {
          bVar7 = cVar1 - 0x30;
        }
        dst[lVar11] = bVar7 | (((puVar5[iVar3] >> 0xb & 1) == 0) * '\t' + (char)iVar3) * '\x10';
        iVar10 = iVar10 + 2;
      }
    }
    else {
      if ((is_form_url_encoded == 0) || (cVar1 != '+')) goto LAB_00105ecf;
      dst[lVar11] = ' ';
    }
    iVar10 = iVar10 + 1;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int mg_url_decode(const char *src, int src_len, char *dst,
                  int dst_len, int is_form_url_encoded) {
  int i, j, a, b;
#define HEXTOI(x) (isdigit(x) ? x - '0' : x - 'W')

  for (i = j = 0; i < src_len && j < dst_len - 1; i++, j++) {
    if (src[i] == '%' && i < src_len - 2 &&
        isxdigit(* (const unsigned char *) (src + i + 1)) &&
        isxdigit(* (const unsigned char *) (src + i + 2))) {
      a = tolower(* (const unsigned char *) (src + i + 1));
      b = tolower(* (const unsigned char *) (src + i + 2));
      dst[j] = (char) ((HEXTOI(a) << 4) | HEXTOI(b));
      i += 2;
    } else if (is_form_url_encoded && src[i] == '+') {
      dst[j] = ' ';
    } else {
      dst[j] = src[i];
    }
  }

  dst[j] = '\0'; // Null-terminate the destination

  return i >= src_len ? j : -1;
}